

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall
Js::ScriptContext::RegisterWeakReferenceDictionary
          (ScriptContext *this,IWeakReferenceDictionary *weakReferenceDictionary)

{
  ArenaAllocator *allocator;
  IWeakReferenceDictionary *local_18;
  IWeakReferenceDictionary *weakReferenceDictionary_local;
  ScriptContext *this_local;
  
  local_18 = weakReferenceDictionary;
  weakReferenceDictionary_local = (IWeakReferenceDictionary *)this;
  allocator = GeneralAllocator(this);
  SListBase<JsUtil::IWeakReferenceDictionary_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&this->weakReferenceDictionaryList,allocator,&local_18);
  return;
}

Assistant:

void ScriptContext::RegisterWeakReferenceDictionary(JsUtil::IWeakReferenceDictionary* weakReferenceDictionary)
    {
        this->weakReferenceDictionaryList.Prepend(this->GeneralAllocator(), weakReferenceDictionary);
    }